

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O0

uint Assimp::strtoul16(char *in,char **out)

{
  undefined4 local_1c;
  uint value;
  char **out_local;
  char *in_local;
  
  local_1c = 0;
  out_local = (char **)in;
  do {
    if ((*(char *)out_local < '0') || ('9' < *(char *)out_local)) {
      if ((*(char *)out_local < 'A') || ('F' < *(char *)out_local)) {
        if ((*(char *)out_local < 'a') || ('f' < *(char *)out_local)) {
          if (out != (char **)0x0) {
            *out = (char *)out_local;
          }
          return local_1c;
        }
        local_1c = (local_1c * 0x10 + (int)*(char *)out_local) - 0x57;
      }
      else {
        local_1c = (local_1c * 0x10 + (int)*(char *)out_local) - 0x37;
      }
    }
    else {
      local_1c = local_1c * 0x10 + *(char *)out_local + -0x30;
    }
    out_local = (char **)((long)out_local + 1);
  } while( true );
}

Assistant:

inline
unsigned int strtoul16( const char* in, const char** out=0) {
    unsigned int value( 0 );
    for ( ;; ) {
        if ( *in >= '0' && *in <= '9' ) {
            value = ( value << 4u ) + ( *in - '0' );
        } else if (*in >= 'A' && *in <= 'F') {
            value = ( value << 4u ) + ( *in - 'A' ) + 10;
        } else if (*in >= 'a' && *in <= 'f') {
            value = ( value << 4u ) + ( *in - 'a' ) + 10;
        } else {
            break;
        }
        ++in;
    }
    if ( out ) {
        *out = in;
    }
    return value;
}